

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O0

int mm_write_mtx_crd(char *fname,int M,int N,int nz,int *I,int *J,double *val,char *matcode)

{
  int iVar1;
  char *pcVar2;
  int local_44;
  FILE *pFStack_40;
  int i;
  FILE *f;
  int *J_local;
  int *I_local;
  int nz_local;
  int N_local;
  int M_local;
  char *fname_local;
  
  iVar1 = strcmp(fname,"stdout");
  if (iVar1 == 0) {
    pFStack_40 = _stdout;
  }
  else {
    pFStack_40 = fopen(fname,"w");
    if (pFStack_40 == (FILE *)0x0) {
      return 0x11;
    }
  }
  fprintf(pFStack_40,"%s ","%%MatrixMarket");
  pcVar2 = mm_typecode_to_str(matcode);
  fprintf(pFStack_40,"%s\n",pcVar2);
  fprintf(pFStack_40,"%d %d %d\n",(ulong)(uint)M,(ulong)(uint)N,(ulong)(uint)nz);
  if (matcode[2] == 'P') {
    for (local_44 = 0; local_44 < nz; local_44 = local_44 + 1) {
      fprintf(pFStack_40,"%d %d\n",(ulong)(uint)I[local_44],(ulong)(uint)J[local_44]);
    }
  }
  else if (matcode[2] == 'R') {
    for (local_44 = 0; local_44 < nz; local_44 = local_44 + 1) {
      fprintf(pFStack_40,"%d %d %20.16g\n",val[local_44],(ulong)(uint)I[local_44],
              (ulong)(uint)J[local_44]);
    }
  }
  else {
    if (matcode[2] != 'C') {
      if (pFStack_40 != _stdout) {
        fclose(pFStack_40);
      }
      return 0xf;
    }
    for (local_44 = 0; local_44 < nz; local_44 = local_44 + 1) {
      fprintf(pFStack_40,"%d %d %20.16g %20.16g\n",val[local_44 << 1],val[local_44 * 2 + 1],
              (ulong)(uint)I[local_44],(ulong)(uint)J[local_44]);
    }
  }
  if (pFStack_40 != _stdout) {
    fclose(pFStack_40);
  }
  return 0;
}

Assistant:

int mm_write_mtx_crd(char fname[], int M, int N, int nz, int I[], int J[],
                     double val[], MM_typecode matcode) {
    FILE *f;
    int i;

    if (strcmp(fname, "stdout") == 0)
        f = stdout;
    else if ((f = fopen(fname, "w")) == NULL)
        return MM_COULD_NOT_WRITE_FILE;

    /* print banner followed by typecode */
    fprintf(f, "%s ", MatrixMarketBanner);
    fprintf(f, "%s\n", mm_typecode_to_str(matcode));

    /* print matrix sizes and nonzeros */
    fprintf(f, "%d %d %d\n", M, N, nz);

    /* print values */
    if (mm_is_pattern(matcode))
        for (i = 0; i < nz; i++)
            fprintf(f, "%d %d\n", I[i], J[i]);
    else if (mm_is_real(matcode))
        for (i = 0; i < nz; i++)
            fprintf(f, "%d %d %20.16g\n", I[i], J[i], val[i]);
    else if (mm_is_complex(matcode))
        for (i = 0; i < nz; i++)
            fprintf(f, "%d %d %20.16g %20.16g\n", I[i], J[i], val[2 * i],
                    val[2 * i + 1]);
    else {
        if (f != stdout) fclose(f);
        return MM_UNSUPPORTED_TYPE;
    }

    if (f != stdout) fclose(f);

    return 0;
}